

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

CoverpointSymbol *
slang::ast::CoverpointSymbol::fromImplicit(Scope *scope,IdentifierNameSyntax *syntax)

{
  SourceLocation loc_00;
  CoverpointSymbol *pCVar1;
  ImplicitTypeSyntax *newType;
  ExpressionSyntax *in_RSI;
  Compilation *in_RDI;
  string_view sVar2;
  SourceLocation unaff_retaddr;
  CoverpointSymbol *result;
  Compilation *comp;
  SourceLocation loc;
  Token *in_stack_ffffffffffffffb0;
  DeclaredType *this;
  SourceLocation *in_stack_ffffffffffffffb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  
  loc_00 = parsing::Token::location((Token *)(in_RSI + 1));
  Scope::getCompilation((Scope *)in_RDI);
  sVar2 = parsing::Token::valueText(in_stack_ffffffffffffffb0);
  pCVar1 = BumpAllocator::
           emplace<slang::ast::CoverpointSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&>
                     ((BumpAllocator *)sVar2._M_str,(Compilation *)sVar2._M_len,
                      in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pCVar1->isImplicit = true;
  this = &pCVar1->declaredType;
  newType = Compilation::createEmptyTypeSyntax(in_RDI,unaff_retaddr);
  DeclaredType::setTypeSyntax(this,&newType->super_DataTypeSyntax);
  DeclaredType::setInitializerSyntax(&pCVar1->declaredType,in_RSI,loc_00);
  return pCVar1;
}

Assistant:

CoverpointSymbol& CoverpointSymbol::fromImplicit(const Scope& scope,
                                                 const IdentifierNameSyntax& syntax) {
    auto loc = syntax.identifier.location();
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverpointSymbol>(comp, syntax.identifier.valueText(), loc);

    result->isImplicit = true;
    result->declaredType.setTypeSyntax(comp.createEmptyTypeSyntax(loc));
    result->declaredType.setInitializerSyntax(syntax, loc);
    return *result;
}